

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

Own<capnp::SchemaFile,_std::nullptr_t>
capnp::SchemaFile::newFromDirectory
          (ReadableDirectory *baseDir,Path *path,
          ArrayPtr<const_kj::ReadableDirectory_*const> importPath,
          Maybe<kj::String> *displayNameOverride)

{
  SchemaFile *extraout_RDX;
  Maybe<kj::String> *in_R9;
  PathPtr path_00;
  Own<capnp::SchemaFile,_std::nullptr_t> OVar1;
  Own<const_kj::ReadableFile,_std::nullptr_t> OStack_68;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> local_58;
  ArrayPtr<const_kj::ReadableDirectory_*const> local_40;
  
  local_40.ptr = (ReadableDirectory **)importPath.size_;
  path_00.parts.size_ = (size_t)(((Path *)importPath.ptr)->parts).ptr;
  path_00.parts.ptr = (String *)path;
  local_40.size_ = (size_t)displayNameOverride;
  kj::ReadableDirectory::openFile((ReadableDirectory *)&OStack_68,path_00);
  kj::
  heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
            ((kj *)&local_58,(ReadableDirectory *)path,(Path *)importPath.ptr,&local_40,&OStack_68,
             in_R9);
  (baseDir->super_FsNode)._vptr_FsNode = (_func_int **)local_58.disposer;
  baseDir[1].super_FsNode._vptr_FsNode = (_func_int **)local_58.ptr;
  local_58.ptr = (DiskSchemaFile *)0x0;
  kj::Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t>::dispose(&local_58);
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&OStack_68);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)baseDir;
  return OVar1;
}

Assistant:

kj::Own<SchemaFile> SchemaFile::newFromDirectory(
    const kj::ReadableDirectory& baseDir, kj::Path path,
    kj::ArrayPtr<const kj::ReadableDirectory* const> importPath,
    kj::Maybe<kj::String> displayNameOverride) {
  return kj::heap<DiskSchemaFile>(baseDir, kj::mv(path), importPath, baseDir.openFile(path),
                                  kj::mv(displayNameOverride));
}